

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O0

bool duckdb::StringValueResult::AddRow(StringValueResult *result,idx_t buffer_pos)

{
  bool bVar1;
  StringValueResult *in_RSI;
  byte *in_RDI;
  idx_t size;
  char *value_ptr;
  StringValueResult *in_stack_00000268;
  bool in_stack_000002c7;
  idx_t in_stack_000002c8;
  char *in_stack_000002d0;
  idx_t in_stack_000002d8;
  StringValueResult *in_stack_000002e0;
  bool in_stack_0000091f;
  idx_t in_stack_00000920;
  char *in_stack_00000928;
  StringValueResult *in_stack_00000930;
  NewLineIdentifier local_21;
  long local_20;
  idx_t in_stack_ffffffffffffffe8;
  
  if (*(StringValueResult **)(in_RDI + 0x10) <= in_RSI) {
    if ((*in_RDI & 1) == 0) {
      local_20 = (long)in_RSI - *(long *)(in_RDI + 0x10);
      if ((in_RDI[2] & 1) == 0) {
        AddValueToVector(in_stack_00000930,in_stack_00000928,in_stack_00000920,in_stack_0000091f);
      }
      else {
        AddPossiblyEscapedValue
                  (in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,
                   in_stack_000002c7);
      }
    }
    else {
      AddQuotedValue(in_RSI,in_stack_ffffffffffffffe8);
    }
    local_21 = CARRY_ON;
    bVar1 = CSVOption<duckdb::NewLineIdentifier>::operator==
                      ((CSVOption<duckdb::NewLineIdentifier> *)(*(long *)(in_RDI + 0x30) + 0x76),
                       &local_21);
    if (bVar1) {
      if (*(char *)(*(long *)(in_RDI + 0x38) + 1) == '\x05') {
        *(bool **)(in_RDI + 0x10) = &(in_RSI->super_ScannerResult).unquoted;
      }
      else {
        *(bool **)(in_RDI + 0x10) = &(in_RSI->super_ScannerResult).escaped;
      }
    }
    else {
      *(bool **)(in_RDI + 0x10) = &(in_RSI->super_ScannerResult).unquoted;
    }
  }
  bVar1 = AddRowInternal(in_stack_00000268);
  return bVar1;
}

Assistant:

bool StringValueResult::AddRow(StringValueResult &result, const idx_t buffer_pos) {
	if (result.last_position.buffer_pos <= buffer_pos) {
		// We add the value
		if (result.quoted) {
			AddQuotedValue(result, buffer_pos);
		} else {
			char *value_ptr = result.buffer_ptr + result.last_position.buffer_pos;
			idx_t size = buffer_pos - result.last_position.buffer_pos;
			if (result.escaped) {
				AddPossiblyEscapedValue(result, buffer_pos, value_ptr, size, size == 0);
			} else {
				result.AddValueToVector(value_ptr, size);
			}
		}
		if (result.state_machine.dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
			if (result.states.states[1] == CSVState::RECORD_SEPARATOR) {
				// Even though this is marked as a carry on, this is a hippie mixie
				result.last_position.buffer_pos = buffer_pos + 1;
			} else {
				result.last_position.buffer_pos = buffer_pos + 2;
			}
		} else {
			result.last_position.buffer_pos = buffer_pos + 1;
		}
	}

	// We add the value
	return result.AddRowInternal();
}